

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_stop_doc(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  csubstr val;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  NodeData *node;
  Parser *in_RDI;
  char msg_1 [31];
  char msg [41];
  size_t doc_node;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  Location *in_stack_fffffffffffffe90;
  undefined1 *in_stack_fffffffffffffeb8;
  Tree *in_stack_fffffffffffffec0;
  basic_substring<const_char> local_130;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  size_t local_100;
  char local_f8 [48];
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  undefined1 local_a8 [56];
  Tree *local_70;
  Tree *local_60;
  Tree *local_58;
  NodeData *local_50;
  Tree *local_48;
  Tree *more_flags;
  Tree *this_00;
  Tree *pTVar6;
  
  local_70 = (Tree *)in_RDI->m_state->node_id;
  pNVar5 = Tree::_p(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
  if (((pNVar5->m_type).type & DOC) == NOTYPE) {
    memcpy(local_a8,"check failed: (m_tree->is_doc(doc_node))",0x29);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    in_stack_fffffffffffffec0 = (Tree *)(in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffeb8 = local_a8;
    Location::Location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    (*(code *)in_stack_fffffffffffffec0)
              (in_stack_fffffffffffffeb8,0x29,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffe70 = uStack_c8;
    in_stack_fffffffffffffe74 = uStack_c4;
    in_stack_fffffffffffffe78 = local_c0;
    in_stack_fffffffffffffe7c = uStack_bc;
    in_stack_fffffffffffffe80 = uStack_b8;
    in_stack_fffffffffffffe84 = uStack_b4;
    in_stack_fffffffffffffe88 = local_b0;
  }
  pTVar6 = in_RDI->m_tree;
  this_00 = local_70;
  pNVar5 = Tree::_p(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
  if (((pNVar5->m_type).type & SEQ) == NOTYPE) {
    more_flags = in_RDI->m_tree;
    local_48 = local_70;
    node = Tree::_p(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    if (((node->m_type).type & MAP) == NOTYPE) {
      local_58 = in_RDI->m_tree;
      local_60 = local_70;
      local_50 = Tree::_p(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
      if (((local_50->m_type).type & KEYVAL) != VAL) {
        bVar3 = has_none(in_RDI,0x200);
        if (!bVar3) {
          builtin_strncpy(local_f8,"check failed: (has_none(SSCL))",0x1f);
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
          Location::Location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          LVar2.super_LineCol.line._0_4_ = (int)uStack_118;
          LVar2.super_LineCol.offset = local_120;
          LVar2.super_LineCol.line._4_4_ = (int)((ulong)uStack_118 >> 0x20);
          LVar2.super_LineCol.col._0_4_ = (int)local_110;
          LVar2.super_LineCol.col._4_4_ = (int)((ulong)local_110 >> 0x20);
          LVar2.name.str._0_4_ = (int)uStack_108;
          LVar2.name.str._4_4_ = (int)((ulong)uStack_108 >> 0x20);
          LVar2.name.len = local_100;
          (*p_Var1)(local_f8,0x1f,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
        }
        basic_substring<const_char>::basic_substring(&local_130);
        val.len = (size_t)pNVar5;
        val.str = (char *)pTVar6;
        Tree::to_val(this_00,(size_t)node,val,(type_bits)more_flags);
      }
    }
  }
  return;
}

Assistant:

void Parser::_stop_doc()
{
    size_t doc_node = m_state->node_id;
    _c4dbgpf("stop_doc[{}]", doc_node);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_doc(doc_node));
    if(!m_tree->is_seq(doc_node) && !m_tree->is_map(doc_node) && !m_tree->is_val(doc_node))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
        _c4dbgpf("stop_doc[{}]: there was nothing; adding null val", doc_node);
        m_tree->to_val(doc_node, {}, DOC);
    }
}